

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

ModportItemSyntax * __thiscall slang::parsing::Parser::parseModportItem(Parser *this)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token closeParen_00;
  Token name_00;
  Token openParen_00;
  Info *pIVar1;
  ModportItemSyntax *pMVar2;
  long in_RDI;
  AnsiPortListSyntax *ports;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> items;
  Token closeParen;
  Token openParen;
  Token name;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *in_stack_00000120;
  Token *in_stack_00000128;
  TokenKind in_stack_00000132;
  TokenKind in_stack_00000134;
  TokenKind in_stack_00000136;
  ParserBase *in_stack_00000138;
  Token *in_stack_00000150;
  RequireItems in_stack_00000158;
  DiagCode in_stack_00000160;
  anon_class_8_1_8991fb9c *in_stack_00000168;
  AllowEmpty in_stack_00000170;
  AnsiPortListSyntax *ports_00;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffefc;
  __extent_storage<18446744073709551615UL> _Var5;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff0c;
  TokenKind in_stack_ffffffffffffff7e;
  ParserBase *in_stack_ffffffffffffff80;
  undefined1 local_60 [12];
  undefined4 local_54;
  Token local_20;
  
  local_20 = ParserBase::expect(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7e);
  Token::Token((Token *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  Token::Token((Token *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::span
            ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0x5e406e);
  local_54 = 0x460005;
  ports_00 = (AnsiPortListSyntax *)&stack0xffffffffffffffc0;
  _Var5._M_extent_value = (size_t)local_60;
  uVar3 = 1;
  uVar4 = 0x460005;
  uVar6 = 0;
  ParserBase::
  parseList<&slang::syntax::SyntaxFacts::isPossibleModportPort,&slang::syntax::SyntaxFacts::isEndOfParenList,slang::parsing::Parser::parseModportItem()::__0>
            (in_stack_00000138,in_stack_00000136,in_stack_00000134,in_stack_00000132,
             in_stack_00000128,in_stack_00000120,in_stack_00000150,in_stack_00000158,
             in_stack_00000160,in_stack_00000168,in_stack_00000170);
  pIVar1 = (Info *)(in_RDI + 0xe0);
  elements._M_ptr._4_4_ = in_stack_fffffffffffffefc;
  elements._M_ptr._0_4_ = uVar4;
  elements._M_extent._M_extent_value = _Var5._M_extent_value;
  slang::syntax::SeparatedSyntaxList<slang::syntax::MemberSyntax>::SeparatedSyntaxList
            ((SeparatedSyntaxList<slang::syntax::MemberSyntax> *)
             CONCAT44(in_stack_fffffffffffffef4,uVar3),elements);
  openParen_00.rawLen = in_stack_ffffffffffffff0c;
  openParen_00.kind = (short)uVar6;
  openParen_00._2_1_ = (char)((uint)uVar6 >> 0x10);
  openParen_00.numFlags.raw = (char)((uint)uVar6 >> 0x18);
  openParen_00.info = pIVar1;
  closeParen_00.rawLen = in_stack_fffffffffffffefc;
  closeParen_00.kind = (short)uVar4;
  closeParen_00._2_1_ = (char)((uint)uVar4 >> 0x10);
  closeParen_00.numFlags.raw = (char)((uint)uVar4 >> 0x18);
  closeParen_00.info = (Info *)_Var5._M_extent_value;
  slang::syntax::SyntaxFactory::ansiPortList
            ((SyntaxFactory *)CONCAT44(in_stack_fffffffffffffef4,uVar3),openParen_00,
             (SeparatedSyntaxList<slang::syntax::MemberSyntax> *)ports_00,closeParen_00);
  name_00.rawLen = in_stack_fffffffffffffefc;
  name_00.kind = (short)uVar4;
  name_00._2_1_ = (char)((uint)uVar4 >> 0x10);
  name_00.numFlags.raw = (char)((uint)uVar4 >> 0x18);
  name_00.info = (Info *)_Var5._M_extent_value;
  pMVar2 = slang::syntax::SyntaxFactory::modportItem
                     ((SyntaxFactory *)CONCAT44(in_stack_fffffffffffffef4,uVar3),name_00,ports_00);
  return pMVar2;
}

Assistant:

ModportItemSyntax& Parser::parseModportItem() {
    auto name = expect(TokenKind::Identifier);

    Token openParen, closeParen;
    std::span<TokenOrSyntax> items;
    parseList<isPossibleModportPort, isEndOfParenList>(
        TokenKind::OpenParenthesis, TokenKind::CloseParenthesis, TokenKind::Comma, openParen, items,
        closeParen, RequireItems::True, diag::ExpectedModportPort,
        [this] { return &parseModportPort(); });

    auto& ports = factory.ansiPortList(openParen, items, closeParen);
    return factory.modportItem(name, ports);
}